

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  zip *pzVar4;
  uLong uVar5;
  bool bVar6;
  archive_rb_tree *paVar7;
  uint16_t uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  void *pvVar12;
  zip_entry *pzVar13;
  archive_rb_node *paVar14;
  la_int64_t lVar15;
  long lVar16;
  int *piVar17;
  Bytef *pBVar18;
  long request;
  uint direction;
  uchar *puVar19;
  char *pcVar20;
  char *pcVar21;
  int iVar22;
  int64_t iVar23;
  zip *rbt;
  archive_string *as;
  archive_rb_node *paVar24;
  ssize_t bytes_avail;
  archive_rb_node *local_80;
  archive_rb_node *local_78;
  archive_rb_node *local_70;
  Bytef *local_68;
  archive_rb_tree *local_60;
  char *local_58;
  undefined8 local_50;
  archive_entry *local_48;
  zip *local_40;
  z_stream *local_38;
  
  pzVar4 = (zip *)a->format->data;
  if (pzVar4->has_encrypted_entries == -1) {
    pzVar4->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar4->zip_entries == (zip_entry *)0x0) {
    bVar6 = false;
    local_48 = entry;
    iVar23 = __archive_read_seek(a,pzVar4->central_directory_offset_adjusted,0);
    wVar10 = L'\xffffffe2';
    if (-1 < iVar23) {
      pvVar12 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
      if (pvVar12 != (void *)0x0) {
        do {
          if ((long)local_70 < 5) {
            __archive_read_consume(a,0);
          }
          else {
            iVar23 = 0;
            bVar6 = false;
            do {
              cVar1 = *(char *)((long)pvVar12 + iVar23 + 3);
              switch(cVar1) {
              case '\x02':
                if (*(int *)((long)pvVar12 + iVar23) != 0x2014b50) goto switchD_001092aa_caseD_3;
LAB_001092f3:
                pvVar12 = (void *)((long)pvVar12 + iVar23);
                bVar6 = true;
                break;
              case '\x03':
              case '\x04':
switchD_001092aa_caseD_3:
                iVar23 = iVar23 + 4;
                break;
              case '\x06':
                if ((*(int *)((long)pvVar12 + iVar23) == 0x6054b50) ||
                   (*(int *)((long)pvVar12 + iVar23) == 0x6064b50)) goto LAB_001092f3;
              case '\x01':
              case '\x05':
                iVar23 = iVar23 + 1;
                break;
              default:
                if (cVar1 == 'P') {
                  iVar23 = iVar23 + 3;
                }
                else {
                  if (cVar1 != 'K') goto switchD_001092aa_caseD_3;
                  iVar23 = iVar23 + 2;
                }
              }
            } while ((!bVar6) && (iVar23 < (long)((long)&local_70[-1].rb_info + 4)));
            __archive_read_consume(a,iVar23);
            if (bVar6) {
              lVar15 = archive_filter_bytes(&a->archive,0);
              local_50 = lVar15 - pzVar4->central_directory_offset;
              local_60 = &pzVar4->tree;
              __archive_rb_tree_init(local_60,&rb_ops);
              local_40 = (zip *)&pzVar4->tree_rsrc;
              __archive_rb_tree_init((archive_rb_tree *)local_40,&rb_rsrc_ops);
              pzVar4->central_directory_entries_total = 0;
              goto LAB_00109386;
            }
          }
          pvVar12 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
        } while (pvVar12 != (void *)0x0);
      }
      goto LAB_001097a0;
    }
    goto LAB_001097a3;
  }
  pzVar13 = pzVar4->entry;
  if (pzVar13 != (zip_entry *)0x0) {
    direction = 1;
    goto LAB_001097b9;
  }
  goto LAB_001097c2;
LAB_00109386:
  do {
    piVar17 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
    if (piVar17 == (int *)0x0) {
LAB_001093c9:
      iVar22 = 1;
    }
    else {
      iVar22 = 8;
      if ((*piVar17 != 0x6064b50) && (*piVar17 != 0x6054b50)) {
        if (*piVar17 != 0x2014b50) {
          iVar22 = -1;
          pcVar21 = "Invalid central directory signature";
LAB_001093c2:
          archive_set_error(&a->archive,iVar22,pcVar21);
          goto LAB_001093c9;
        }
        pvVar12 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
        if (pvVar12 != (void *)0x0) {
          pzVar13 = (zip_entry *)calloc(1,0x90);
          if (pzVar13 != (zip_entry *)0x0) {
            pzVar13->next = pzVar4->zip_entries;
            pzVar13->flags = pzVar13->flags | 2;
            pzVar4->zip_entries = pzVar13;
            pzVar4->central_directory_entries_total = pzVar4->central_directory_entries_total + 1;
            pzVar13->system = *(uchar *)((long)pvVar12 + 5);
            bVar2 = *(byte *)((long)pvVar12 + 8);
            pzVar13->zip_flags = *(uint16_t *)((long)pvVar12 + 8);
            if ((bVar2 & 0x41) != 0) {
              pzVar4->has_encrypted_entries = 1;
            }
            pzVar13->compression = *(uchar *)((long)pvVar12 + 10);
            iVar23 = dos_to_unix(*(uint32_t *)((long)pvVar12 + 0xc));
            pzVar13->mtime = iVar23;
            pzVar13->crc32 = *(uint32_t *)((long)pvVar12 + 0x10);
            puVar19 = (uchar *)((long)pvVar12 + 0x13);
            if ((pzVar13->zip_flags & 8) != 0) {
              puVar19 = (uchar *)((long)pvVar12 + 0xd);
            }
            pzVar13->decdat = *puVar19;
            pzVar13->compressed_size = (ulong)*(uint *)((long)pvVar12 + 0x14);
            pzVar13->uncompressed_size = (ulong)*(uint *)((long)pvVar12 + 0x18);
            uVar3 = *(ushort *)((long)pvVar12 + 0x1c);
            local_78 = (archive_rb_node *)(ulong)uVar3;
            paVar14 = (archive_rb_node *)(ulong)*(ushort *)((long)pvVar12 + 0x1e);
            local_68 = (Bytef *)(ulong)*(ushort *)((long)pvVar12 + 0x20);
            uVar8 = *(uint16_t *)((long)pvVar12 + 0x28);
            bVar2 = *(byte *)((long)pvVar12 + 0x26);
            pzVar13->local_header_offset = (ulong)*(uint *)((long)pvVar12 + 0x2a) + local_50;
            if (pzVar13->system == '\0') {
              uVar8 = 0x41fd;
              if ((bVar2 & 0x10) == 0) {
                uVar8 = 0x81b4;
              }
              pzVar13->mode = uVar8;
              if ((bVar2 & 1) != 0) {
                pzVar13->mode = pzVar13->mode & 0x16d;
              }
            }
            else if (pzVar13->system == '\x03') {
              pzVar13->mode = uVar8;
            }
            else {
              pzVar13->mode = 0;
            }
            __archive_read_consume(a,0x2e);
            pcVar21 = (char *)((long)paVar14->rb_nodes + (long)local_78);
            local_80 = (archive_rb_node *)__archive_read_ahead(a,(size_t)pcVar21,(ssize_t *)0x0);
            if (local_80 == (archive_rb_node *)0x0) {
              iVar22 = 0x54;
              pcVar21 = "Truncated ZIP file header";
              local_80 = paVar14;
              goto LAB_001093c2;
            }
            pcVar20 = (char *)((long)local_80->rb_nodes + (long)local_78);
            local_58 = pcVar21;
            wVar9 = process_extra(a,local_48,pcVar20,(size_t)paVar14,pzVar13);
            iVar22 = 1;
            if (wVar9 != L'\0') goto LAB_001093ce;
            paVar14 = local_80;
            if (pzVar4->process_mac_extensions == 0) {
              __archive_rb_tree_insert_node(local_60,(archive_rb_node *)pzVar13);
            }
            else {
              do {
                paVar24 = paVar14;
                pvVar12 = memchr(paVar24,0x2f,(long)pcVar20 - (long)paVar24);
                paVar14 = (archive_rb_node *)((long)pvVar12 + 1);
              } while (pvVar12 != (void *)0x0);
              if ((uVar3 < 9) || (iVar22 = strncmp("__MACOSX/",(char *)local_80,9), iVar22 != 0)) {
                if (uVar3 == 0) {
                  local_78 = (archive_rb_node *)0x0;
                }
                else if (pcVar20[-1] == '/') {
                  lVar16 = (long)local_78 - 1;
                  local_78 = (archive_rb_node *)((long)local_78 - 1);
                  paVar14 = local_80;
                  do {
                    paVar24 = paVar14;
                    pvVar12 = memchr(paVar24,0x2f,
                                     (size_t)((long)local_80 + (lVar16 - (long)paVar24)));
                    paVar14 = (archive_rb_node *)((long)pvVar12 + 1);
                  } while (pvVar12 != (void *)0x0);
                }
                as = &pzVar13->rsrcname;
                (pzVar13->rsrcname).length = 0;
                archive_strncat(as,"__MACOSX/",9);
                local_38 = (z_stream *)((long)paVar24 - (long)local_80);
                archive_strncat(as,local_80,(size_t)local_38);
                archive_strcat(as,"._");
                archive_strncat(as,paVar24,(long)local_78 - (long)local_38);
                rbt = (zip *)local_60;
              }
              else {
                if ((pcVar20[-1] != '/') &&
                   ((((long)paVar24 - (long)local_80 < 3 || (*(char *)paVar24->rb_nodes != '.')) ||
                    (*(char *)((long)paVar24->rb_nodes + 1) != '_')))) {
                  __archive_rb_tree_insert_node(local_60,(archive_rb_node *)pzVar13);
                  expose_parent_dirs(pzVar4,(char *)local_80,(size_t)local_78);
                  goto LAB_0010970f;
                }
                (pzVar13->rsrcname).length = 0;
                archive_strncat(&pzVar13->rsrcname,local_80,(size_t)local_78);
                rbt = local_40;
              }
              __archive_rb_tree_insert_node((archive_rb_tree *)rbt,(archive_rb_node *)pzVar13);
            }
LAB_0010970f:
            __archive_read_consume(a,(int64_t)(local_58 + (long)local_68));
            iVar22 = 0;
            goto LAB_001093ce;
          }
          archive_set_error(&a->archive,0xc,"Can\'t allocate zip entry");
        }
        iVar22 = 1;
      }
    }
LAB_001093ce:
  } while (iVar22 == 0);
  if (iVar22 == 8) {
    wVar10 = L'\0';
    bVar6 = true;
  }
  else {
LAB_001097a0:
    bVar6 = false;
  }
LAB_001097a3:
  if (!bVar6) {
    return wVar10;
  }
  pzVar13 = (zip_entry *)0x0;
  direction = 0;
  entry = local_48;
LAB_001097b9:
  pzVar13 = (zip_entry *)__archive_rb_tree_iterate(&pzVar4->tree,&pzVar13->node,direction);
  pzVar4->entry = pzVar13;
LAB_001097c2:
  if (pzVar4->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar21 = (pzVar4->entry->rsrcname).s;
  if (pcVar21 == (char *)0x0) {
    paVar14 = (archive_rb_node *)0x0;
  }
  else {
    paVar14 = __archive_rb_tree_find_node(&pzVar4->tree_rsrc,pcVar21);
  }
  if (pzVar4->cctx_valid != '\0') {
    aes_ctr_release(&pzVar4->cctx);
  }
  if (pzVar4->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar4->hctx);
  }
  pzVar4->hctx_valid = '\0';
  pzVar4->cctx_valid = '\0';
  pzVar4->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar15 = archive_filter_bytes(&a->archive,0);
  lVar16 = pzVar4->entry->local_header_offset;
  request = lVar16 - lVar15;
  if (request == 0 || lVar16 < lVar15) {
    if (request != 0) {
      __archive_read_seek(a,lVar16,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar4->unconsumed = 0;
  wVar10 = zip_read_local_file_header(a,entry,pzVar4);
  if (wVar10 != L'\0') {
    return wVar10;
  }
  if (paVar14 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar4 = (zip *)a->format->data;
  lVar15 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar14[5].rb_nodes + 1);
  if (bVar2 == 8) {
LAB_001098d5:
    pcVar21 = (char *)paVar14[2].rb_nodes[0];
    if ((long)pcVar21 < 0x400001) {
      if ((long)paVar14[1].rb_info < 0x400001) {
        local_68 = (Bytef *)malloc((size_t)pcVar21);
        if (local_68 == (Bytef *)0x0) {
          pcVar21 = "Can\'t allocate memory for Mac metadata";
          iVar22 = 0xc;
          local_68 = (Bytef *)0x0;
          goto LAB_001099aa;
        }
        paVar24 = paVar14[1].rb_nodes[1];
        lVar16 = (long)paVar24 - lVar15;
        if (lVar16 == 0 || (long)paVar24 < lVar15) {
          if (lVar16 != 0) {
            __archive_read_seek(a,(int64_t)paVar24,0);
          }
        }
        else {
          __archive_read_consume(a,lVar16);
        }
        piVar17 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
        local_58 = (char *)lVar15;
        if (piVar17 == (int *)0x0) {
          pcVar21 = "Truncated ZIP file header";
          iVar22 = 0x54;
LAB_00109a1e:
          archive_set_error(&a->archive,iVar22,pcVar21);
          iVar23 = -0x14;
        }
        else {
          if (*piVar17 != 0x4034b50) {
            pcVar21 = "Damaged Zip archive";
            iVar22 = -1;
            goto LAB_00109a1e;
          }
          iVar23 = (ulong)*(ushort *)((long)piVar17 + 0x1a) + (ulong)*(ushort *)(piVar17 + 7) + 0x1e
          ;
        }
        __archive_read_consume(a,iVar23);
        paVar24 = (archive_rb_node *)paVar14[1].rb_info;
        local_78 = paVar14[2].rb_nodes[0];
        local_38 = &pzVar4->stream;
        wVar10 = L'\0';
        iVar22 = 0;
        local_60 = (archive_rb_tree *)local_68;
        local_48 = entry;
        local_40 = pzVar4;
        do {
          pBVar18 = local_68;
          if ((iVar22 != 0) || (paVar24 == (archive_rb_node *)0x0)) {
            archive_entry_copy_mac_metadata
                      (local_48,local_68,(long)paVar14[2].rb_nodes[0] - (long)local_78);
            goto LAB_00109ca5;
          }
          pBVar18 = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
          pzVar4 = local_40;
          paVar7 = local_60;
          if (pBVar18 == (Bytef *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
            iVar11 = 5;
            wVar10 = L'\xffffffec';
          }
          else {
            if (paVar24 < local_70) {
              local_70 = paVar24;
            }
            if (*(char *)(paVar14[5].rb_nodes + 1) == '\b') {
              local_50 = (ulong)local_50._4_4_ << 0x20;
              wVar10 = zip_deflate_init(a,local_40);
              paVar7 = local_60;
              if (wVar10 == L'\0') {
                (pzVar4->stream).next_in = pBVar18;
                (pzVar4->stream).avail_in = (uInt)local_70;
                (pzVar4->stream).total_in = 0;
                (pzVar4->stream).next_out = (Bytef *)local_60;
                (pzVar4->stream).avail_out = (uInt)local_78;
                (pzVar4->stream).total_out = 0;
                iVar22 = inflate(local_38,0);
                if (iVar22 == -4) {
                  archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
LAB_00109c3a:
                  bVar6 = false;
                  wVar10 = L'\xffffffe2';
                }
                else {
                  if (iVar22 != 0) {
                    if (iVar22 != 1) {
                      archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)");
                      goto LAB_00109c3a;
                    }
                    local_50 = CONCAT44(local_50._4_4_,1);
                  }
                  local_80 = (archive_rb_node *)(pzVar4->stream).total_in;
                  uVar5 = (pzVar4->stream).total_out;
                  local_78 = (archive_rb_node *)((long)local_78 - uVar5);
                  local_60 = (archive_rb_tree *)((long)paVar7 + uVar5);
                  bVar6 = true;
                  wVar10 = L'\0';
                }
              }
              else {
                bVar6 = false;
              }
              iVar11 = 5;
              iVar22 = (int)local_50;
              if (!bVar6) goto LAB_00109c68;
            }
            else if (*(char *)(paVar14[5].rb_nodes + 1) == '\0') {
              local_50 = (ulong)local_50._4_4_ << 0x20;
              if (local_78 < local_70) {
                local_70 = local_78;
              }
              memcpy(local_60,pBVar18,(size_t)local_70);
              local_60 = (archive_rb_tree *)((long)paVar7 + (long)local_70);
              local_78 = (archive_rb_node *)((long)local_78 - (long)local_70);
              local_80 = local_70;
              iVar22 = (int)local_50;
              if (local_78 == (archive_rb_node *)0x0) {
                iVar22 = 1;
              }
            }
            else {
              local_80 = (archive_rb_node *)0x0;
            }
            __archive_read_consume(a,(int64_t)local_80);
            paVar24 = (archive_rb_node *)((long)paVar24 - (long)local_80);
            iVar11 = 0;
          }
LAB_00109c68:
        } while (iVar11 == 0);
        pBVar18 = local_68;
        if (iVar11 == 5) {
LAB_00109ca5:
          __archive_read_seek(a,(int64_t)local_58,0);
          local_40->decompress_init = '\0';
          free(pBVar18);
        }
        goto LAB_001099b7;
      }
      pcVar20 = "Mac metadata is too large: %jd > 4M bytes";
      pcVar21 = (char *)paVar14[1].rb_info;
    }
    else {
      pcVar20 = "Mac metadata is too large: %jd > 4M bytes";
    }
  }
  else {
    if (bVar2 == 0) {
      if (paVar14[2].rb_nodes[0] == (archive_rb_node *)paVar14[1].rb_info) goto LAB_001098d5;
      pcVar21 = "Malformed OS X metadata entry: inconsistent size";
      iVar22 = 0x54;
LAB_001099aa:
      archive_set_error(&a->archive,iVar22,pcVar21);
      wVar10 = L'\xffffffe2';
      goto LAB_001099b7;
    }
    lVar16 = 8;
    pcVar21 = "??";
    do {
      if (*(uint *)((long)&none_reader_vtable.read_header + lVar16) == (uint)bVar2) {
        pcVar21 = *(char **)((long)&compression_methods[0].id + lVar16);
        break;
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x1a8);
    pcVar20 = "Unsupported ZIP compression method (%s)";
  }
  archive_set_error(&a->archive,0x54,pcVar20,pcVar21);
  wVar10 = L'\xffffffec';
LAB_001099b7:
  return wVar10 >> 0x1f & wVar10;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, entry, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid
	 * redundant data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}